

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Performance::TextureUploadCallCase::iterate(TextureUploadCallCase *this)

{
  int iVar1;
  qpTestResult qVar2;
  State SVar3;
  int iVar4;
  deUint32 err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  deUint64 dVar6;
  deUint64 dVar7;
  qpWatchDog *dog_00;
  qpWatchDog *dog;
  deUint64 duration;
  deUint64 endTime;
  int i;
  deUint64 startTime;
  int numCalls;
  State state;
  Functions *gl;
  TextureUploadCallCase *this_local;
  
  pRVar5 = Context::getRenderContext((this->super_TextureUploadCase).super_TestCase.m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  qVar2 = tcu::TestContext::getTestResult
                    ((this->super_TextureUploadCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx);
  if (qVar2 == QP_TEST_RESULT_NOT_SUPPORTED) {
    return STOP;
  }
  do {
    SVar3 = deqp::gls::TheilSenCalibrator::getState(&(this->super_TextureUploadCase).m_calibrator);
    if (SVar3 == STATE_MEASURE) {
      iVar4 = deqp::gls::TheilSenCalibrator::getCallCount
                        (&(this->super_TextureUploadCase).m_calibrator);
      dVar6 = deGetMicroseconds();
      for (endTime._4_4_ = 0; endTime._4_4_ < iVar4; endTime._4_4_ = endTime._4_4_ + 1) {
        render(this);
      }
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x648))();
      dVar7 = deGetMicroseconds();
      deqp::gls::TheilSenCalibrator::recordIteration
                (&(this->super_TextureUploadCase).m_calibrator,dVar7 - dVar6);
    }
    else {
      if (SVar3 != STATE_RECOMPUTE_PARAMS) {
        err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
        glu::checkError(err,"iterate",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                        ,0x177);
        TextureUploadCase::logResults(&this->super_TextureUploadCase);
        return STOP;
      }
      deqp::gls::TheilSenCalibrator::recomputeParameters
                (&(this->super_TextureUploadCase).m_calibrator);
    }
    dog_00 = tcu::TestContext::getWatchDog
                       ((this->super_TextureUploadCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    if (dog_00 != (qpWatchDog *)0x0) {
      qpWatchDog_touch(dog_00);
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureUploadCallCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_testCtx.getTestResult() == QP_TEST_RESULT_NOT_SUPPORTED)
		return STOP;

	for (;;)
	{
		gls::TheilSenCalibrator::State state = m_calibrator.getState();

		if (state == gls::TheilSenCalibrator::STATE_MEASURE)
		{
			int			numCalls	= m_calibrator.getCallCount();
			deUint64	startTime	= deGetMicroseconds();

			for (int i = 0; i < numCalls; i++)
				render();

			gl.finish();

			deUint64	endTime		= deGetMicroseconds();
			deUint64	duration	= endTime-startTime;

			m_calibrator.recordIteration(duration);
		}
		else if (state == gls::TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
		{
			m_calibrator.recomputeParameters();
		}
		else
		{
			DE_ASSERT(state == gls::TheilSenCalibrator::STATE_FINISHED);
			break;
		}

		// Touch watchdog between iterations to avoid timeout.
		{
			qpWatchDog* dog = m_testCtx.getWatchDog();
			if (dog)
				qpWatchDog_touch(dog);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "iterate");
	logResults();
	return STOP;
}